

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_step(xpath_parser *this,xpath_ast_node *set)

{
  xpath_lexer *this_00;
  byte bVar1;
  lexeme_t lVar2;
  nodetest_t nVar3;
  size_t length;
  xpath_ast_node *pxVar4;
  xpath_ast_node *pxVar5;
  xpath_ast_node *pxVar6;
  xpath_ast_node **ppxVar7;
  long lVar8;
  xpath_parse_result *pxVar9;
  char *pcVar10;
  char cVar11;
  xpath_parser *this_01;
  long lVar12;
  xpath_parser *name;
  size_t __n;
  char_t *__dest;
  xpath_ast_node *pxVar13;
  bool bVar14;
  char local_3c;
  
  if ((set != (xpath_ast_node *)0x0) && (set->_rettype != '\x01')) {
    pxVar9 = this->_result;
    pcVar10 = "Step has to be applied to node set";
    goto LAB_00114a10;
  }
  lVar2 = (this->_lexer)._cur_lexeme;
  this_00 = &this->_lexer;
  if (lVar2 == lex_double_dot) {
    xpath_lexer::next(this_00);
    if ((this->_lexer)._cur_lexeme != lex_open_square_brace) {
      pxVar4 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar4 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar4->_type = '8';
      pxVar4->_rettype = '\x01';
      pxVar4->_axis = '\t';
      pxVar4->_test = '\x02';
LAB_0011462f:
      pxVar4->_left = set;
      pxVar4->_right = (xpath_ast_node *)0x0;
      pxVar4->_next = (xpath_ast_node *)0x0;
      (pxVar4->_data).string = (char_t *)0x0;
      return pxVar4;
    }
  }
  else {
    if (lVar2 != lex_dot) {
      bVar14 = lVar2 != lex_axis_attribute;
      if (bVar14) {
        local_3c = '\x03';
      }
      else {
        xpath_lexer::next(this_00);
        lVar2 = (this->_lexer)._cur_lexeme;
        local_3c = '\x02';
      }
      if (lVar2 == lex_multiply) {
LAB_00114524:
        xpath_lexer::next(this_00);
        __dest = "";
        cVar11 = '\a';
      }
      else {
        if (lVar2 != lex_string) {
LAB_00114a05:
          pxVar9 = this->_result;
          pcVar10 = "Unrecognized node test";
          goto LAB_00114a10;
        }
        this_01 = (xpath_parser *)(this->_lexer)._cur_lexeme_contents.begin;
        name = (xpath_parser *)(this->_lexer)._cur_lexeme_contents.end;
        xpath_lexer::next(this_00);
        lVar2 = (this->_lexer)._cur_lexeme;
        if (lVar2 == lex_double_colon) {
          if (!bVar14) {
            pxVar9 = this->_result;
            pcVar10 = "Two axis specifiers in one step";
            goto LAB_00114a10;
          }
          bVar1 = *(byte *)&this_01->_alloc;
          if (bVar1 < 0x6e) {
            switch(bVar1) {
            case 0x61:
              lVar12 = (long)name - (long)this_01;
              if (lVar12 != 0) {
                lVar8 = 0;
                do {
                  if ("ancestor"[lVar8] != this_01->_scratch[lVar8 + -0x48]) goto LAB_001146ab;
                  lVar8 = lVar8 + 1;
                } while (lVar12 != lVar8);
              }
              if ("ancestor"[lVar12] == '\0') {
                local_3c = '\0';
              }
              else {
LAB_001146ab:
                if (name != this_01) {
                  lVar8 = 0;
                  do {
                    if ("ancestor-or-self"[lVar8] != this_01->_scratch[lVar8 + -0x48])
                    goto LAB_001146dc;
                    lVar8 = lVar8 + 1;
                  } while (lVar12 != lVar8);
                }
                if ("ancestor-or-self"[lVar12] == '\0') {
                  local_3c = '\x01';
                }
                else {
LAB_001146dc:
                  if (name != this_01) {
                    lVar8 = 0;
                    do {
                      if ("Error parsing element attribute"[lVar8 + 0x16] !=
                          this_01->_scratch[lVar8 + -0x48]) goto switchD_00114675_caseD_62;
                      lVar8 = lVar8 + 1;
                    } while (lVar12 != lVar8);
                  }
                  if ("Error parsing element attribute"[lVar12 + 0x16] != '\0')
                  goto switchD_00114675_caseD_62;
                  local_3c = '\x02';
                }
              }
              break;
            default:
switchD_00114675_caseD_62:
              pxVar9 = this->_result;
              pcVar10 = "Unknown axis";
              goto LAB_00114a10;
            case 99:
              lVar12 = (long)name - (long)this_01;
              if (lVar12 != 0) {
                lVar8 = 0;
                do {
                  if ("!doc->first_child"[lVar8 + 0xc] != this_01->_scratch[lVar8 + -0x48])
                  goto switchD_00114675_caseD_62;
                  lVar8 = lVar8 + 1;
                } while (lVar12 != lVar8);
              }
              if ("!doc->first_child"[lVar12 + 0xc] != '\0') goto switchD_00114675_caseD_62;
              local_3c = '\x03';
              break;
            case 100:
              lVar12 = (long)name - (long)this_01;
              if (lVar12 != 0) {
                lVar8 = 0;
                do {
                  if ("descendant"[lVar8] != this_01->_scratch[lVar8 + -0x48]) goto LAB_001147b6;
                  lVar8 = lVar8 + 1;
                } while (lVar12 != lVar8);
              }
              if ("descendant"[lVar12] == '\0') {
                local_3c = '\x04';
              }
              else {
LAB_001147b6:
                if (name != this_01) {
                  lVar8 = 0;
                  do {
                    if ("descendant-or-self"[lVar8] != this_01->_scratch[lVar8 + -0x48])
                    goto switchD_00114675_caseD_62;
                    lVar8 = lVar8 + 1;
                  } while (lVar12 != lVar8);
                }
                if ("descendant-or-self"[lVar12] != '\0') goto switchD_00114675_caseD_62;
                local_3c = '\x05';
              }
              break;
            case 0x66:
              lVar12 = (long)name - (long)this_01;
              if (lVar12 != 0) {
                lVar8 = 0;
                do {
                  if ("following"[lVar8] != this_01->_scratch[lVar8 + -0x48]) goto LAB_00114827;
                  lVar8 = lVar8 + 1;
                } while (lVar12 != lVar8);
              }
              if ("following"[lVar12] == '\0') {
                local_3c = '\x06';
              }
              else {
LAB_00114827:
                if (name != this_01) {
                  lVar8 = 0;
                  do {
                    if ("following-sibling"[lVar8] != this_01->_scratch[lVar8 + -0x48])
                    goto switchD_00114675_caseD_62;
                    lVar8 = lVar8 + 1;
                  } while (lVar12 != lVar8);
                }
                if ("following-sibling"[lVar12] != '\0') goto switchD_00114675_caseD_62;
                local_3c = '\a';
              }
            }
          }
          else if (bVar1 == 0x6e) {
            lVar12 = (long)name - (long)this_01;
            if (lVar12 != 0) {
              lVar8 = 0;
              do {
                if ("namespace"[lVar8] != this_01->_scratch[lVar8 + -0x48])
                goto switchD_00114675_caseD_62;
                lVar8 = lVar8 + 1;
              } while (lVar12 != lVar8);
            }
            if ("namespace"[lVar12] != '\0') goto switchD_00114675_caseD_62;
            local_3c = '\b';
          }
          else {
            if (bVar1 != 0x70) {
              if (bVar1 == 0x73) {
                lVar12 = (long)name - (long)this_01;
                if (lVar12 != 0) {
                  lVar8 = 0;
                  do {
                    if ("ancestor-or-self"[lVar8 + 0xc] != this_01->_scratch[lVar8 + -0x48])
                    goto switchD_00114675_caseD_62;
                    lVar8 = lVar8 + 1;
                  } while (lVar12 != lVar8);
                }
                if ("ancestor-or-self"[lVar12 + 0xc] == '\0') {
                  local_3c = '\f';
                  goto LAB_0011499a;
                }
              }
              goto switchD_00114675_caseD_62;
            }
            lVar12 = (long)name - (long)this_01;
            if (lVar12 != 0) {
              lVar8 = 0;
              do {
                if ("ln->parent == rn->parent"[lVar8 + 0x12] != this_01->_scratch[lVar8 + -0x48])
                goto LAB_00114910;
                lVar8 = lVar8 + 1;
              } while (lVar12 != lVar8);
            }
            if ("ln->parent == rn->parent"[lVar12 + 0x12] == '\0') {
              local_3c = '\t';
            }
            else {
LAB_00114910:
              if (name != this_01) {
                lVar8 = 0;
                do {
                  if ("preceding"[lVar8] != this_01->_scratch[lVar8 + -0x48]) goto LAB_0011493d;
                  lVar8 = lVar8 + 1;
                } while (lVar12 != lVar8);
              }
              if ("preceding"[lVar12] == '\0') {
                local_3c = '\n';
              }
              else {
LAB_0011493d:
                if (name != this_01) {
                  lVar8 = 0;
                  do {
                    if ("preceding-sibling"[lVar8] != this_01->_scratch[lVar8 + -0x48])
                    goto switchD_00114675_caseD_62;
                    lVar8 = lVar8 + 1;
                  } while (lVar12 != lVar8);
                }
                if ("preceding-sibling"[lVar12] != '\0') goto switchD_00114675_caseD_62;
                local_3c = '\v';
              }
            }
          }
LAB_0011499a:
          xpath_lexer::next(this_00);
          lVar2 = (this->_lexer)._cur_lexeme;
          if (lVar2 == lex_multiply) goto LAB_00114524;
          if (lVar2 != lex_string) goto LAB_00114a05;
          this_01 = (xpath_parser *)(this->_lexer)._cur_lexeme_contents.begin;
          name = (xpath_parser *)(this->_lexer)._cur_lexeme_contents.end;
          xpath_lexer::next(this_00);
          lVar2 = (this->_lexer)._cur_lexeme;
        }
        if (lVar2 == lex_open_brace) {
          xpath_lexer::next(this_00);
          lVar2 = (this->_lexer)._cur_lexeme;
          if (lVar2 != lex_close_brace) {
            lVar12 = (long)name - (long)this_01;
            if (lVar12 != 0) {
              lVar8 = 0;
              do {
                if ("processing-instruction"[lVar8] != this_01->_scratch[lVar8 + -0x48])
                goto LAB_00114ad4;
                lVar8 = lVar8 + 1;
              } while (lVar12 != lVar8);
            }
            if ("processing-instruction"[lVar12] != '\0') {
LAB_00114ad4:
              pxVar9 = this->_result;
              pcVar10 = "Unmatched brace near node type test";
              goto LAB_00114a10;
            }
            if (lVar2 != lex_quoted_string) {
              pxVar9 = this->_result;
              pcVar10 = "Only literals are allowed as arguments to processing-instruction()";
              goto LAB_00114a10;
            }
            this_01 = (xpath_parser *)(this->_lexer)._cur_lexeme_contents.begin;
            name = (xpath_parser *)(this->_lexer)._cur_lexeme_contents.end;
            xpath_lexer::next(this_00);
            if ((this->_lexer)._cur_lexeme != lex_close_brace) {
              pxVar9 = this->_result;
              pcVar10 = "Unmatched brace near processing-instruction()";
              goto LAB_00114a10;
            }
            xpath_lexer::next(this_00);
            nVar3 = nodetest_pi;
            goto LAB_00114a61;
          }
          xpath_lexer::next(this_00);
          nVar3 = parse_node_test_type(this_01,(xpath_lexer_string *)name);
          if (nVar3 == nodetest_none) {
            pxVar9 = this->_result;
            pcVar10 = "Unrecognized node type";
            goto LAB_00114a10;
          }
        }
        else {
          nVar3 = nodetest_name;
          if ((2 < (long)name - (long)this_01) && (name[-1]._scratch[0x1e] == ':')) {
            bVar14 = name[-1]._scratch[0x1f] == '*';
            if (bVar14) {
              name = (xpath_parser *)(name[-1]._scratch + 0x1f);
            }
            nVar3 = nodetest_name;
            if (bVar14) {
              nVar3 = nodetest_all_in_namespace;
            }
          }
LAB_00114a61:
          cVar11 = (char)nVar3;
          if (this_01 != (xpath_parser *)0x0) {
            __n = (long)name - (long)this_01;
            __dest = (char_t *)xpath_allocator::allocate(this->_alloc,__n + 1);
            if (__dest == (char_t *)0x0) {
              return (xpath_ast_node *)0x0;
            }
            memcpy(__dest,this_01,__n);
            __dest[__n] = '\0';
            goto LAB_00114538;
          }
        }
        cVar11 = (char)nVar3;
        __dest = "";
      }
LAB_00114538:
      pxVar4 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar4 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar4->_type = '8';
      pxVar4->_rettype = '\x01';
      pxVar4->_axis = local_3c;
      pxVar4->_test = cVar11;
      pxVar4->_left = set;
      pxVar4->_right = (xpath_ast_node *)0x0;
      pxVar4->_next = (xpath_ast_node *)0x0;
      (pxVar4->_data).string = __dest;
      if ((this->_lexer)._cur_lexeme != lex_open_square_brace) {
        return pxVar4;
      }
      pxVar13 = (xpath_ast_node *)0x0;
      while( true ) {
        xpath_lexer::next(this_00);
        pxVar5 = parse_expression(this,0);
        if (pxVar5 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        pxVar6 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar6 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        pxVar6->_type = '\x10';
        pxVar6->_rettype = '\x01';
        pxVar6->_axis = '\0';
        pxVar6->_test = '\0';
        pxVar6->_left = (xpath_ast_node *)0x0;
        pxVar6->_right = pxVar5;
        pxVar6->_next = (xpath_ast_node *)0x0;
        if ((this->_lexer)._cur_lexeme != lex_close_square_brace) break;
        xpath_lexer::next(this_00);
        ppxVar7 = &pxVar13->_next;
        if (pxVar13 == (xpath_ast_node *)0x0) {
          ppxVar7 = &pxVar4->_right;
        }
        *ppxVar7 = pxVar6;
        pxVar13 = pxVar6;
        if ((this->_lexer)._cur_lexeme != lex_open_square_brace) {
          return pxVar4;
        }
      }
      pxVar9 = this->_result;
      pcVar10 = "Expected \']\' to match an opening \'[\'";
      goto LAB_00114a10;
    }
    xpath_lexer::next(this_00);
    if ((this->_lexer)._cur_lexeme != lex_open_square_brace) {
      pxVar4 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar4 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar4->_type = '8';
      pxVar4->_rettype = '\x01';
      pxVar4->_axis = '\f';
      pxVar4->_test = '\x02';
      goto LAB_0011462f;
    }
  }
  pxVar9 = this->_result;
  pcVar10 = "Predicates are not allowed after an abbreviated step";
LAB_00114a10:
  pxVar9->error = pcVar10;
  pxVar9->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
  return (xpath_ast_node *)0x0;
}

Assistant:

xpath_ast_node* parse_step(xpath_ast_node* set)
		{
			if (set && set->rettype() != xpath_type_node_set)
				return error("Step has to be applied to node set");

			bool axis_specified = false;
			axis_t axis = axis_child; // implied child axis

			if (_lexer.current() == lex_axis_attribute)
			{
				axis = axis_attribute;
				axis_specified = true;

				_lexer.next();
			}
			else if (_lexer.current() == lex_dot)
			{
				_lexer.next();

				if (_lexer.current() == lex_open_square_brace)
					return error("Predicates are not allowed after an abbreviated step");

				return alloc_node(ast_step, set, axis_self, nodetest_type_node, 0);
			}
			else if (_lexer.current() == lex_double_dot)
			{
				_lexer.next();

				if (_lexer.current() == lex_open_square_brace)
					return error("Predicates are not allowed after an abbreviated step");

				return alloc_node(ast_step, set, axis_parent, nodetest_type_node, 0);
			}

			nodetest_t nt_type = nodetest_none;
			xpath_lexer_string nt_name;

			if (_lexer.current() == lex_string)
			{
				// node name test
				nt_name = _lexer.contents();
				_lexer.next();

				// was it an axis name?
				if (_lexer.current() == lex_double_colon)
				{
					// parse axis name
					if (axis_specified)
						return error("Two axis specifiers in one step");

					axis = parse_axis_name(nt_name, axis_specified);

					if (!axis_specified)
						return error("Unknown axis");

					// read actual node test
					_lexer.next();

					if (_lexer.current() == lex_multiply)
					{
						nt_type = nodetest_all;
						nt_name = xpath_lexer_string();
						_lexer.next();
					}
					else if (_lexer.current() == lex_string)
					{
						nt_name = _lexer.contents();
						_lexer.next();
					}
					else
					{
						return error("Unrecognized node test");
					}
				}

				if (nt_type == nodetest_none)
				{
					// node type test or processing-instruction
					if (_lexer.current() == lex_open_brace)
					{
						_lexer.next();

						if (_lexer.current() == lex_close_brace)
						{
							_lexer.next();

							nt_type = parse_node_test_type(nt_name);

							if (nt_type == nodetest_none)
								return error("Unrecognized node type");

							nt_name = xpath_lexer_string();
						}
						else if (nt_name == PUGIXML_TEXT("processing-instruction"))
						{
							if (_lexer.current() != lex_quoted_string)
								return error("Only literals are allowed as arguments to processing-instruction()");

							nt_type = nodetest_pi;
							nt_name = _lexer.contents();
							_lexer.next();

							if (_lexer.current() != lex_close_brace)
								return error("Unmatched brace near processing-instruction()");
							_lexer.next();
						}
						else
						{
							return error("Unmatched brace near node type test");
						}
					}
					// QName or NCName:*
					else
					{
						if (nt_name.end - nt_name.begin > 2 && nt_name.end[-2] == ':' && nt_name.end[-1] == '*') // NCName:*
						{
							nt_name.end--; // erase *

							nt_type = nodetest_all_in_namespace;
						}
						else
						{
							nt_type = nodetest_name;
						}
					}
				}
			}
			else if (_lexer.current() == lex_multiply)
			{
				nt_type = nodetest_all;
				_lexer.next();
			}
			else
			{
				return error("Unrecognized node test");
			}

			const char_t* nt_name_copy = alloc_string(nt_name);
			if (!nt_name_copy) return 0;

			xpath_ast_node* n = alloc_node(ast_step, set, axis, nt_type, nt_name_copy);
			if (!n) return 0;

			xpath_ast_node* last = 0;

			while (_lexer.current() == lex_open_square_brace)
			{
				_lexer.next();

				xpath_ast_node* expr = parse_expression();
				if (!expr) return 0;

				xpath_ast_node* pred = alloc_node(ast_predicate, 0, expr, predicate_default);
				if (!pred) return 0;

				if (_lexer.current() != lex_close_square_brace)
					return error("Expected ']' to match an opening '['");
				_lexer.next();

				if (last) last->set_next(pred);
				else n->set_right(pred);

				last = pred;
			}

			return n;
		}